

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeBase * CreateFunctionContextType(ExpressionContext *ctx,SynBase *source,InplaceStr functionName)

{
  Allocator *allocator;
  int iVar1;
  undefined4 extraout_var;
  InplaceStr name;
  SynIdentifier local_80;
  TypeClass *this;
  
  name = GetFunctionContextTypeName(ctx,functionName,(ctx->functions).count);
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x180);
  this = (TypeClass *)CONCAT44(extraout_var,iVar1);
  allocator = ctx->allocator;
  SynIdentifier::SynIdentifier(&local_80,name);
  TypeClass::TypeClass
            (this,allocator,&local_80,source,ctx->scope,(TypeGenericClassProto *)0x0,
             (IntrusiveList<MatchData>)ZEXT816(0),false,(TypeClass *)0x0);
  this->isInternal = true;
  ExpressionContext::AddType(ctx,(TypeBase *)this);
  ExpressionContext::PushScope(ctx,(TypeBase *)this);
  (this->super_TypeStruct).typeScope = ctx->scope;
  ExpressionContext::PopScope(ctx,SCOPE_TYPE);
  this->completed = true;
  return (TypeBase *)this;
}

Assistant:

TypeBase* CreateFunctionContextType(ExpressionContext &ctx, SynBase *source, InplaceStr functionName)
{
	InplaceStr functionContextName = GetFunctionContextTypeName(ctx, functionName, ctx.functions.size());

	TypeClass *contextClassType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, SynIdentifier(functionContextName), source, ctx.scope, NULL, IntrusiveList<MatchData>(), false, NULL);

	contextClassType->isInternal = true;

	ctx.AddType(contextClassType);

	ctx.PushScope(contextClassType);

	contextClassType->typeScope = ctx.scope;

	ctx.PopScope(SCOPE_TYPE);

	contextClassType->completed = true;

	return contextClassType;
}